

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
CMeshClosestPointMapper::SeamTool::Data::Set
          (Data *this,ON_SimpleArray<int> *seamless,ON_SimpleArray<int> *seamed)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_28;
  int local_24;
  int i_1;
  int i;
  ON_SimpleArray<int> *seamed_local;
  ON_SimpleArray<int> *seamless_local;
  Data *this_local;
  
  iVar1 = ON_SimpleArray<int>::Count(seamless);
  if (iVar1 < 5) {
    iVar1 = ON_SimpleArray<int>::Count(seamless);
    this->m_nSeamless = iVar1;
  }
  else {
    this->m_nSeamless = 4;
  }
  for (local_24 = 0; local_24 < this->m_nSeamless; local_24 = local_24 + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](seamless,local_24);
    this->m_neighbourFis[local_24] = *piVar3;
  }
  iVar1 = this->m_nSeamless;
  iVar2 = ON_SimpleArray<int>::Count(seamed);
  if (iVar1 + iVar2 < 5) {
    iVar1 = ON_SimpleArray<int>::Count(seamed);
    this->m_nSeamed = iVar1;
  }
  else {
    this->m_nSeamed = 4 - this->m_nSeamless;
  }
  for (local_28 = 0; local_28 < this->m_nSeamed; local_28 = local_28 + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](seamed,local_28);
    this->m_neighbourFis[this->m_nSeamless + local_28] = *piVar3;
  }
  return;
}

Assistant:

void Set(const ON_SimpleArray<int>& seamless, const ON_SimpleArray<int>& seamed)
      {
        if (seamless.Count() <= capacity)
          m_nSeamless = seamless.Count();
        else
          m_nSeamless = capacity;
        for (int i = 0; i < m_nSeamless; i++)
          m_neighbourFis[i] = seamless[i];

        if (m_nSeamless + seamed.Count() <= capacity)
          m_nSeamed = seamed.Count();
        else
          m_nSeamed = capacity - m_nSeamless;
        for (int i = 0; i < m_nSeamed; i++)
          m_neighbourFis[m_nSeamless + i] = seamed[i];
      }